

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int seekAndRead(unixFile *id,sqlite3_int64 offset,void *pBuf,int cnt)

{
  __off64_t _Var1;
  int *piVar2;
  i64 newOffset;
  int local_30;
  int prior;
  int got;
  int cnt_local;
  void *pBuf_local;
  sqlite3_int64 offset_local;
  unixFile *id_local;
  
  newOffset._4_4_ = 0;
  prior = cnt;
  _got = pBuf;
  pBuf_local = (void *)offset;
  do {
    _Var1 = lseek64(id->h,(__off64_t)pBuf_local,0);
    if (_Var1 < 0) {
      piVar2 = __errno_location();
      storeLastErrno(id,*piVar2);
      return -1;
    }
    local_30 = (*aSyscall[8].pCurrent)((ulong)(uint)id->h,_got,(long)prior);
    if (local_30 == prior) break;
    if (local_30 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        newOffset._4_4_ = 0;
        piVar2 = __errno_location();
        storeLastErrno(id,*piVar2);
        break;
      }
      local_30 = 1;
    }
    else if (0 < local_30) {
      prior = prior - local_30;
      pBuf_local = (void *)((long)local_30 + (long)pBuf_local);
      newOffset._4_4_ = local_30 + newOffset._4_4_;
      _got = (void *)((long)_got + (long)local_30);
    }
  } while (0 < local_30);
  return local_30 + newOffset._4_4_;
}

Assistant:

static int seekAndRead(unixFile *id, sqlite3_int64 offset, void *pBuf, int cnt){
  int got;
  int prior = 0;
#if (!defined(USE_PREAD) && !defined(USE_PREAD64))
  i64 newOffset;
#endif
  TIMER_START;
  assert( cnt==(cnt&0x1ffff) );
  assert( id->h>2 );
  do{
#if defined(USE_PREAD)
    got = osPread(id->h, pBuf, cnt, offset);
    SimulateIOError( got = -1 );
#elif defined(USE_PREAD64)
    got = osPread64(id->h, pBuf, cnt, offset);
    SimulateIOError( got = -1 );
#else
    newOffset = lseek(id->h, offset, SEEK_SET);
    SimulateIOError( newOffset = -1 );
    if( newOffset<0 ){
      storeLastErrno((unixFile*)id, errno);
      return -1;
    }
    got = osRead(id->h, pBuf, cnt);
#endif
    if( got==cnt ) break;
    if( got<0 ){
      if( errno==EINTR ){ got = 1; continue; }
      prior = 0;
      storeLastErrno((unixFile*)id,  errno);
      break;
    }else if( got>0 ){
      cnt -= got;
      offset += got;
      prior += got;
      pBuf = (void*)(got + (char*)pBuf);
    }
  }while( got>0 );
  TIMER_END;
  OSTRACE(("READ    %-3d %5d %7lld %llu\n",
            id->h, got+prior, offset-prior, TIMER_ELAPSED));
  return got+prior;
}